

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginTest.cpp
# Opt level: O3

void __thiscall
TEST_PluginTest_InstallMultiplePlugins_Test::testBody
          (TEST_PluginTest_InstallMultiplePlugins_Test *this)

{
  TestRegistry *pTVar1;
  DummyPlugin *pDVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  UtestShell *pUVar5;
  char *pcVar6;
  char *pcVar7;
  TestTerminator *pTVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  SimpleString local_50;
  SimpleString local_40;
  SimpleString local_30;
  
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).registry;
  (*pTVar1->_vptr_TestRegistry[0xd])
            (pTVar1,(this->super_TEST_GROUP_CppUTestGroupPluginTest).thirdPlugin);
  pDVar2 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin;
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).registry;
  SimpleString::SimpleString(&local_50,"GenericPlugin");
  iVar3 = (*pTVar1->_vptr_TestRegistry[0x10])(pTVar1,&local_50);
  SimpleString::~SimpleString(&local_50);
  if (pDVar2 == (DummyPlugin *)CONCAT44(extraout_var,iVar3)) {
    pUVar5 = UtestShell::getCurrent();
    pTVar8 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x80,pTVar8);
  }
  else {
    pTVar1 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).registry;
    SimpleString::SimpleString(&local_50,"GenericPlugin");
    iVar3 = (*pTVar1->_vptr_TestRegistry[0x10])(pTVar1,&local_50);
    pTVar1 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).registry;
    SimpleString::SimpleString(&local_40,"GenericPlugin");
    iVar4 = (*pTVar1->_vptr_TestRegistry[0x10])(pTVar1,&local_40);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_50);
    if (CONCAT44(extraout_var_00,iVar3) != CONCAT44(extraout_var_01,iVar4)) {
      pUVar5 = UtestShell::getCurrent();
      (*pUVar5->_vptr_UtestShell[0x1c])
                (pUVar5,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                 ,0x80);
    }
    pUVar5 = UtestShell::getCurrent();
    StringFrom(&local_50);
    pcVar6 = SimpleString::asCharString(&local_50);
    pTVar1 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).registry;
    SimpleString::SimpleString(&local_30,"GenericPlugin");
    (*pTVar1->_vptr_TestRegistry[0x10])(pTVar1,&local_30);
    StringFrom(&local_40);
    pcVar7 = SimpleString::asCharString(&local_40);
    pTVar8 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x80,pTVar8);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_30);
    SimpleString::~SimpleString(&local_50);
  }
  pDVar2 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).thirdPlugin;
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).registry;
  SimpleString::SimpleString(&local_50,"GenericPlugin3");
  iVar3 = (*pTVar1->_vptr_TestRegistry[0x10])(pTVar1,&local_50);
  SimpleString::~SimpleString(&local_50);
  if (pDVar2 == (DummyPlugin *)CONCAT44(extraout_var_02,iVar3)) {
    pUVar5 = UtestShell::getCurrent();
    pTVar8 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x81,pTVar8);
  }
  else {
    pTVar1 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).registry;
    SimpleString::SimpleString(&local_50,"GenericPlugin3");
    iVar3 = (*pTVar1->_vptr_TestRegistry[0x10])(pTVar1,&local_50);
    pTVar1 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).registry;
    SimpleString::SimpleString(&local_40,"GenericPlugin3");
    iVar4 = (*pTVar1->_vptr_TestRegistry[0x10])(pTVar1,&local_40);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_50);
    if (CONCAT44(extraout_var_03,iVar3) != CONCAT44(extraout_var_04,iVar4)) {
      pUVar5 = UtestShell::getCurrent();
      (*pUVar5->_vptr_UtestShell[0x1c])
                (pUVar5,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                 ,0x81);
    }
    pUVar5 = UtestShell::getCurrent();
    StringFrom(&local_50);
    pcVar6 = SimpleString::asCharString(&local_50);
    pTVar1 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).registry;
    SimpleString::SimpleString(&local_30,"GenericPlugin3");
    (*pTVar1->_vptr_TestRegistry[0x10])(pTVar1,&local_30);
    StringFrom(&local_40);
    pcVar7 = SimpleString::asCharString(&local_40);
    pTVar8 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x81,pTVar8);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_30);
    SimpleString::~SimpleString(&local_50);
  }
  pUVar5 = UtestShell::getCurrent();
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).registry;
  SimpleString::SimpleString(&local_50,"I do not exist");
  iVar3 = (*pTVar1->_vptr_TestRegistry[0x10])(pTVar1,&local_50);
  pTVar8 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0x13])
            (pUVar5,0,CONCAT44(extraout_var_05,iVar3),0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
             ,0x82,pTVar8);
  SimpleString::~SimpleString(&local_50);
  return;
}

Assistant:

TEST(PluginTest, InstallMultiplePlugins)
{
    registry->installPlugin(thirdPlugin);
    CHECK_EQUAL(firstPlugin, registry->getPluginByName(GENERIC_PLUGIN));
    CHECK_EQUAL(thirdPlugin, registry->getPluginByName(GENERIC_PLUGIN3));
    POINTERS_EQUAL(NULLPTR, registry->getPluginByName("I do not exist"));
}